

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonException.h
# Opt level: O0

void __thiscall Json::JsonException::error_info(JsonException *this,int size)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  JsonReader *this_00;
  string local_2f0 [32];
  int local_2d0;
  allocator<char> local_2c9;
  int i;
  string local_2a8 [32];
  int local_288;
  int local_284;
  int __len;
  int __ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [32];
  long local_1f8;
  stringstream ss;
  ostream local_1e8 [392];
  undefined1 local_60 [8];
  string subErrorTextForward;
  string subErrorTextBackward;
  int len;
  int pos;
  int size_local;
  JsonException *this_local;
  
  this_00 = &this->__reader;
  iVar1 = JsonReader::pos(this_00);
  iVar2 = JsonReader::length(this_00);
  JsonReader::substr_abi_cxx11_
            ((string *)((long)&subErrorTextForward.field_2 + 8),this_00,size,true);
  JsonReader::substr_abi_cxx11_((string *)local_60,this_00,size,false);
  escape_rs(this,(string *)local_60);
  escape_rs(this,(string *)((long)&subErrorTextForward.field_2 + 8));
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1f8);
  poVar3 = std::operator<<(local_1e8,"Error: JSON document parsing failed: [");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1 + -1);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"] ");
  std::operator<<(poVar3,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=((string *)&this->__err,local_218);
  std::__cxx11::string::~string(local_218);
  std::ios::clear((long)&local_1f8 + *(long *)(local_1f8 + -0x18),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"",&local_239);
  std::__cxx11::stringstream::str((string *)&local_1f8);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  poVar3 = std::operator<<(local_1e8,"==> ");
  poVar3 = std::operator<<(poVar3,"Error Text: [...");
  poVar3 = std::operator<<(poVar3,(string *)(subErrorTextForward.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,(string *)local_60);
  std::operator<<(poVar3,"...]");
  std::__cxx11::stringstream::str();
  std::operator+(&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__len,"\n");
  std::__cxx11::string::operator+=((string *)&this->__err,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&__len);
  local_284 = std::__cxx11::string::size();
  local_284 = local_284 + 0x13;
  std::__cxx11::stringstream::str();
  iVar1 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_2a8);
  local_288 = iVar1;
  std::ios::clear((long)&local_1f8 + *(long *)(local_1f8 + -0x18),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"",&local_2c9);
  std::__cxx11::stringstream::str((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_2c9);
  for (local_2d0 = 0; local_2d0 < local_288; local_2d0 = local_2d0 + 1) {
    if (local_2d0 == local_284) {
      std::operator<<(local_1e8,"^");
    }
    else {
      std::operator<<(local_1e8,"~");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=((string *)&this->__err,local_2f0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1f8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(subErrorTextForward.field_2._M_local_buf + 8));
  return;
}

Assistant:

void error_info(int size = 10) const {
            int pos = __reader.pos() - 1;
            int len = __reader.length();
            std::string subErrorTextBackward = __reader.substr(size, true);
            std::string subErrorTextForward = __reader.substr(size);
            escape_rs(subErrorTextForward);
            escape_rs(subErrorTextBackward);
            std::stringstream ss;
            ss << "Error: JSON document parsing failed: [" << pos << "," << len << "] " << "\n";
            __err += ss.str();
            ss.clear(), ss.str("");
            ss << "==> " << "Error Text: [..."
               << subErrorTextBackward
               << subErrorTextForward << "...]";
            __err += ss.str() + "\n";
            int __ptr = subErrorTextBackward.size() + 19;
            int __len = ss.str().size();
            ss.clear(), ss.str("");
            for (int i = 0; i < __len; ++i) {
                if (i == __ptr)
                    ss << "^";
                else
                    ss << "~";
            }
            __err += ss.str();
        }